

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColladaExporter.cpp
# Opt level: O1

void __thiscall Assimp::ColladaExporter::WriteLight(ColladaExporter *this,size_t pIndex)

{
  char *__s;
  undefined1 *puVar1;
  aiLight *light;
  ostream *poVar2;
  string lightId;
  string lightName;
  allocator<char> local_91;
  string local_90;
  string local_70;
  string local_50;
  
  light = this->mScene->mLights[pIndex];
  __s = (light->mName).data;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_90,__s,(allocator<char> *)&local_70);
  XMLEscape(&local_50,&local_90);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,__s,&local_91);
  XMLIDEncode(&local_90,&local_70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  puVar1 = &this->field_0x38;
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)puVar1,(this->startstr)._M_dataplus._M_p,
                      (this->startstr)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"<light id=\"",0xb);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar2,local_90._M_dataplus._M_p,local_90._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"-light\" name=\"",0xe);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar2,local_50._M_dataplus._M_p,local_50._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\" >",3);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar2,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
  std::__cxx11::string::append((char *)&this->startstr);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)puVar1,(this->startstr)._M_dataplus._M_p,
                      (this->startstr)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"<technique_common>",0x12);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar2,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
  std::__cxx11::string::append((char *)&this->startstr);
  switch(light->mType) {
  case aiLightSource_DIRECTIONAL:
    WriteDirectionalLight(this,light);
    break;
  case aiLightSource_POINT:
    WritePointLight(this,light);
    break;
  case aiLightSource_SPOT:
    WriteSpotLight(this,light);
    break;
  case aiLightSource_AMBIENT:
    WriteAmbienttLight(this,light);
  }
  PopTag(this);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)puVar1,(this->startstr)._M_dataplus._M_p,
                      (this->startstr)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"</technique_common>",0x13);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar2,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
  PopTag(this);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)puVar1,(this->startstr)._M_dataplus._M_p,
                      (this->startstr)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"</light>",8);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar2,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void ColladaExporter::WriteLight(size_t pIndex){

    const aiLight *light = mScene->mLights[pIndex];
    const std::string lightName = XMLEscape(light->mName.C_Str());
    const std::string lightId = XMLIDEncode(light->mName.C_Str());

    mOutput << startstr << "<light id=\"" << lightId << "-light\" name=\""
            << lightName << "\" >" << endstr;
    PushTag();
    mOutput << startstr << "<technique_common>" << endstr;
    PushTag();
    switch(light->mType){
        case aiLightSource_AMBIENT:
            WriteAmbienttLight(light);
            break;
        case aiLightSource_DIRECTIONAL:
            WriteDirectionalLight(light);
            break;
        case aiLightSource_POINT:
            WritePointLight(light);
            break;
        case aiLightSource_SPOT:
            WriteSpotLight(light);
            break;
        case aiLightSource_AREA:
        case aiLightSource_UNDEFINED:
        case _aiLightSource_Force32Bit:
            break;
    }
    PopTag();
    mOutput << startstr << "</technique_common>" << endstr;

    PopTag();
    mOutput << startstr << "</light>" << endstr;

}